

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.c
# Opt level: O1

wchar_t effect_subtype(wchar_t index,char *type)

{
  _Bool _Var1;
  wchar_t wVar2;
  int iVar3;
  char *in_RAX;
  long lVar4;
  char *__s2;
  char *pe;
  char *local_28;
  
  local_28 = in_RAX;
  lVar4 = strtol(type,&local_28,10);
  if (local_28 != type) {
    _Var1 = contains_only_spaces(local_28);
    wVar2 = L'\xffffffff';
    if (lVar4 + 0x7fffffffU >> 1 < 0x7fffffff) {
      wVar2 = (wchar_t)lVar4;
    }
    if (!_Var1) {
      return L'\xffffffff';
    }
    return wVar2;
  }
  switch(index) {
  case L'\x06':
    iVar3 = strcmp(type,"INC_BY");
    if (iVar3 == 0) {
      return L'\0';
    }
    iVar3 = strcmp(type,"DEC_BY");
    if (iVar3 == 0) {
      return L'\x01';
    }
    iVar3 = strcmp(type,"SET_TO");
    if (iVar3 == 0) {
      return L'\x02';
    }
    iVar3 = strcmp(type,"INC_TO");
    if (iVar3 == 0) {
      return L'\x03';
    }
    return L'\xffffffff';
  case L'\b':
  case L'\t':
  case L'\n':
  case L'\v':
  case L'\r':
    wVar2 = timed_name_to_idx(type);
    return wVar2;
  case L'\f':
    wVar2 = mon_timed_name_to_idx(type);
    return wVar2;
  case L'\x0e':
    iVar3 = strcmp(type,"WARDING");
    if (iVar3 == 0) {
      return L'\x01';
    }
    iVar3 = strcmp(type,"DECOY");
    if (iVar3 == 0) {
      return L'\x02';
    }
    return L'\xffffffff';
  case L'\x10':
  case L'\x11':
  case L'\x12':
  case L'\x13':
    wVar2 = stat_name_to_idx(type);
    return wVar2;
  case L'0':
    iVar3 = strcmp(type,"TOBOTH");
    if (iVar3 == 0) {
      return L'\x03';
    }
    iVar3 = strcmp(type,"TOHIT");
    if (iVar3 == 0) {
      return L'\x01';
    }
    iVar3 = strcmp(type,"TODAM");
    if (iVar3 == 0) {
      return L'\x02';
    }
    iVar3 = strcmp(type,"TOAC");
    if (iVar3 == 0) {
      return L'\x04';
    }
    return L'\xffffffff';
  case L'2':
  case L'3':
  case L'?':
  case L'E':
  case L'F':
  case L'G':
  case L'H':
  case L'I':
  case L'J':
  case L'K':
  case L'L':
  case L'M':
  case L'N':
  case L'O':
  case L'P':
  case L'Q':
  case L'R':
  case L'S':
  case L'T':
  case L'U':
  case L'V':
  case L'W':
  case L'X':
  case L'Y':
  case L'h':
    wVar2 = proj_name_to_idx(type);
    return wVar2;
  case L'6':
    wVar2 = summon_name_to_idx(type);
    return wVar2;
  case L':':
    __s2 = "AWAY";
    break;
  case L';':
    __s2 = "SELF";
    break;
  case L'@':
    iVar3 = strcmp(type,"TARGETED");
    if (iVar3 == 0) {
      return L'\x01';
    }
  default:
    iVar3 = strcmp(type,"NONE");
    if (iVar3 != 0) {
      return L'\xffffffff';
    }
    return L'\0';
  case L'b':
    wVar2 = shape_name_to_idx(type);
    return wVar2;
  }
  iVar3 = strcmp(type,__s2);
  if (iVar3 != 0) {
    return L'\xffffffff';
  }
  return L'\x01';
}

Assistant:

int effect_subtype(int index, const char *type)
{
	char *pe;
	long lv;

	lv = strtol(type, &pe, 10);
	if (pe != type) {
		/*
		 * Got a plain numeric value.  Verify that there isn't garbage
		 * after it and that it doesn't overflow.  Also reject INT_MIN
		 * and INT_MAX so don't have to check errno to detect overflow
		 * when sizeof(long) == sizeof(int).
		 */
		return (contains_only_spaces(pe) && lv < INT_MAX
			&& lv > INT_MIN) ? (int)lv : -1;
	}
	/* If not a numerical value, assign according to effect index */
	switch (index) {
		/* Projection name */
		case EF_PROJECT_LOS:
		case EF_PROJECT_LOS_AWARE:
		case EF_DESTRUCTION:
		case EF_SPOT:
		case EF_SPHERE:
		case EF_BALL:
		case EF_BREATH:
		case EF_ARC:
		case EF_SHORT_BEAM:
		case EF_LASH:
		case EF_SWARM:
		case EF_STRIKE:
		case EF_STAR:
		case EF_STAR_BALL:
		case EF_BOLT:
		case EF_BEAM:
		case EF_BOLT_OR_BEAM:
		case EF_LINE:
		case EF_ALTER:
		case EF_BOLT_STATUS:
		case EF_BOLT_STATUS_DAM:
		case EF_BOLT_AWARE:
		case EF_MELEE_BLOWS:
		case EF_TOUCH:
		case EF_TOUCH_AWARE:
			return proj_name_to_idx(type);

		/* Timed effect name */
		case EF_CURE:
		case EF_TIMED_SET:
		case EF_TIMED_INC:
		case EF_TIMED_INC_NO_RES:
		case EF_TIMED_DEC:
			return timed_name_to_idx(type);

		/* Nourishment types */
		case EF_NOURISH:
			if (streq(type, "INC_BY")) {
				return 0;
			} else if (streq(type, "DEC_BY")) {
				return 1;
			} else if (streq(type, "SET_TO")) {
				return 2;
			} else if (streq(type, "INC_TO")) {
				return 3;
			}
			break;

		/* Monster timed effect name */
		case EF_MON_TIMED_INC:
			return mon_timed_name_to_idx(type);

		/* Summon name */
		case EF_SUMMON:
			return summon_name_to_idx(type);

		/* Stat name */
		case EF_RESTORE_STAT:
		case EF_DRAIN_STAT:
		case EF_LOSE_RANDOM_STAT:
		case EF_GAIN_STAT:
			return stat_name_to_idx(type);

		/* Enchant type name - not worth a separate function */
		case EF_ENCHANT:
			if (streq(type, "TOBOTH")) {
				return ENCH_TOBOTH;
			} else if (streq(type, "TOHIT")) {
				return ENCH_TOHIT;
			} else if (streq(type, "TODAM")) {
				return ENCH_TODAM;
			} else if (streq(type, "TOAC")) {
				return ENCH_TOAC;
			}
			break;

		/* Player shape name */
		case EF_SHAPECHANGE:
			return shape_name_to_idx(type);

		/* Targeted earthquake */
		case EF_EARTHQUAKE:
			if (streq(type, "TARGETED")) {
				return 1;
			} else if (streq(type, "NONE")) {
				return 0;
			}
			break;

		/* Inscribe a glyph */
		case EF_GLYPH:
			if (streq(type, "WARDING")) {
				return GLYPH_WARDING;
			} else if (streq(type, "DECOY")) {
				return GLYPH_DECOY;
			}
			break;

		/* Allow teleport away */
		case EF_TELEPORT:
			if (streq(type, "AWAY")) {
				return 1;
			}
			break;

		/* Allow monster teleport toward */
		case EF_TELEPORT_TO:
			if (streq(type, "SELF")) {
				return 1;
			}
			break;

		/* Some effects only want a radius, so this is a dummy */
		default:
			if (streq(type, "NONE")) {
				return 0;
			}
			break;
	}

	return -1;
}